

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O1

void __thiscall
bidirectional::BiDirectional::updateEfficientLabels
          (BiDirectional *this,Directions *direction,Label *candidate_label)

{
  int iVar1;
  _Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_> this_00;
  pointer pvVar2;
  pointer pLVar3;
  bool bVar4;
  __normal_iterator<labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
  _Var5;
  
  this_00.super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl =
       (&this->fwd_search_ptr_)[*direction != FWD]._M_t.
       super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>.
       _M_t.
       super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>.
       super__Head_base<0UL,_bidirectional::Search_*,_false>;
  iVar1 = (candidate_label->vertex).lemon_id;
  pvVar2 = (((vector<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
              *)((long)this_00.super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl +
                0x70))->
           super__Vector_base<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<labelling::Label*,std::vector<labelling::Label,std::allocator<labelling::Label>>>,__gnu_cxx::__ops::_Iter_equals_val<labelling::Label_const>>
                    (*(undefined8 *)
                      &pvVar2[iVar1].
                       super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>,
                     *(pointer *)((long)(pvVar2 + iVar1) + 8));
  pLVar3 = *(pointer *)((long)(pvVar2 + iVar1) + 8);
  if (_Var5._M_current != pLVar3) {
    return;
  }
  *(int *)((long)this_00.super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl + 0x10)
       = *(int *)((long)this_00.super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl +
                 0x10) + 1;
  if (0x80 < (ulong)((long)pLVar3 -
                    (long)pvVar2[iVar1].
                          super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>.
                          _M_impl.super__Vector_impl_data._M_start)) {
    bVar4 = labelling::runDominanceEff
                      (pvVar2 + iVar1,candidate_label,direction,
                       &((this->params_ptr_)._M_t.
                         super___uniq_ptr_impl<bidirectional::Params,_std::default_delete<bidirectional::Params>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_bidirectional::Params_*,_std::default_delete<bidirectional::Params>_>
                         .super__Head_base<0UL,_bidirectional::Params_*,_false>._M_head_impl)->
                        elementary);
    if (bVar4) goto LAB_001364e2;
    bVar4 = checkPrimalBound(this,direction,candidate_label);
    if (bVar4) goto LAB_001364e2;
  }
  std::vector<labelling::Label,_std::allocator<labelling::Label>_>::push_back
            ((((vector<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                *)((long)this_00.super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl
                  + 0x70))->
             super__Vector_base<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + (candidate_label->vertex).lemon_id,
             candidate_label);
  std::vector<labelling::Label,_std::allocator<labelling::Label>_>::push_back
            ((vector<labelling::Label,_std::allocator<labelling::Label>_> *)
             (((unique_ptr<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                *)((long)this_00.super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl
                  + 0xa0))->_M_t).
             super___uniq_ptr_impl<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_*,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
             .
             super__Head_base<0UL,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_*,_false>
             ,candidate_label);
  Search::pushHeap((Search *)
                   this_00.super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl);
LAB_001364e2:
  updateBestLabels(this,direction,candidate_label);
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             ((long)this_00.super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl +
             0x20),&(candidate_label->vertex).lemon_id);
  return;
}

Assistant:

void BiDirectional::updateEfficientLabels(
    const Directions&       direction,
    const labelling::Label& candidate_label) {
  Search* search_ptr = getSearchPtr(direction);
  // const ref vertex index
  const int& lemon_id = candidate_label.vertex.lemon_id;
  // ref efficient_labels_ for a given vertex
  std::vector<labelling::Label>& efficient_labels_vertex =
      search_ptr->efficient_labels[lemon_id];

  if (std::find(
          efficient_labels_vertex.begin(),
          efficient_labels_vertex.end(),
          candidate_label) == efficient_labels_vertex.end()) {
    ++search_ptr->generated_count;
    // If there already exists labels for the given vertex
    if (efficient_labels_vertex.size() > 1) {
      // check if new_label is dominated by any other comparable label
      const bool dominated = runDominanceEff(
          &efficient_labels_vertex,
          candidate_label,
          direction,
          params_ptr_->elementary);
      if (!dominated && !checkPrimalBound(direction, candidate_label)) {
        // add candidate_label to efficient_labels and unprocessed heap
        search_ptr->pushEfficientLabel(lemon_id, candidate_label);
        search_ptr->pushUnprocessedLabel(candidate_label);
        SPDLOG_DEBUG("\t Added to the queue.");
      } else {
        SPDLOG_DEBUG("\t Label dominated.");
      }
    } else {
      // First label produced for the vertex
      // update both efficient and unprocessed labels
      search_ptr->pushEfficientLabel(lemon_id, candidate_label);
      search_ptr->pushUnprocessedLabel(candidate_label);
      SPDLOG_DEBUG("\t Added to the queue (no other label at this vertex).");
    }
    updateBestLabels(direction, candidate_label);
    // Update vertices visited
    search_ptr->addVisitedVertex(lemon_id);
  }
}